

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O0

int minisketch_implementation_supported(uint32_t bits,uint32_t implementation)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  Sketch *pSVar4;
  uint in_ESI;
  long in_FS_OFFSET;
  bad_alloc *anon_var_0;
  Sketch *sketch;
  uint32_t in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffc0;
  int local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = minisketch_bits_supported(in_stack_ffffffffffffff98);
  if (iVar2 != 0) {
    uVar3 = minisketch_implementation_max();
    if (in_ESI <= uVar3) {
      pSVar4 = anon_unknown.dwarf_250a9ab::Construct(in_ESI,in_stack_ffffffffffffffc0);
      if (pSVar4 == (Sketch *)0x0) {
        local_c = 0;
      }
      else {
        if (pSVar4 != (Sketch *)0x0) {
          (*pSVar4->_vptr_Sketch[1])();
        }
        local_c = 1;
      }
      goto LAB_0151cb2a;
    }
  }
  local_c = 0;
LAB_0151cb2a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_c;
  }
  __stack_chk_fail();
}

Assistant:

int minisketch_implementation_supported(uint32_t bits, uint32_t implementation) {
    if (!minisketch_bits_supported(bits) || implementation > minisketch_implementation_max()) {
        return 0;
    }
    try {
        Sketch* sketch = Construct(bits, implementation);
        if (sketch) {
            delete sketch;
            return 1;
        }
    } catch (const std::bad_alloc&) {}
    return 0;
}